

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_slow_logs.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_171914::Json2Array<aliyun::RdsDescribeSlowLogsSQLSlowLogType>::Json2Array
          (Json2Array<aliyun::RdsDescribeSlowLogsSQLSlowLogType> *this,Value *value,
          vector<aliyun::RdsDescribeSlowLogsSQLSlowLogType,_std::allocator<aliyun::RdsDescribeSlowLogsSQLSlowLogType>_>
          *vec)

{
  uint uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_128 [8];
  RdsDescribeSlowLogsSQLSlowLogType val;
  int i;
  vector<aliyun::RdsDescribeSlowLogsSQLSlowLogType,_std::allocator<aliyun::RdsDescribeSlowLogsSQLSlowLogType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RdsDescribeSlowLogsSQLSlowLogType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.avg_execution_time._4_4_ = 0; uVar1 = val.avg_execution_time._4_4_,
        AVar3 = Json::Value::size(value), uVar1 < AVar3;
        val.avg_execution_time._4_4_ = val.avg_execution_time._4_4_ + 1) {
      aliyun::RdsDescribeSlowLogsSQLSlowLogType::RdsDescribeSlowLogsSQLSlowLogType
                ((RdsDescribeSlowLogsSQLSlowLogType *)local_128);
      value_00 = Json::Value::operator[](value,val.avg_execution_time._4_4_);
      anon_unknown.dwarf_171914::Json2Type(value_00,(RdsDescribeSlowLogsSQLSlowLogType *)local_128);
      std::
      vector<aliyun::RdsDescribeSlowLogsSQLSlowLogType,_std::allocator<aliyun::RdsDescribeSlowLogsSQLSlowLogType>_>
      ::push_back(vec,(value_type *)local_128);
      aliyun::RdsDescribeSlowLogsSQLSlowLogType::~RdsDescribeSlowLogsSQLSlowLogType
                ((RdsDescribeSlowLogsSQLSlowLogType *)local_128);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }